

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O3

HPDF_STATUS HPDF_Page_SetLineWidth(HPDF_Page page,HPDF_REAL line_width)

{
  void *pvVar1;
  HPDF_STATUS HVar2;
  
  HVar2 = HPDF_Page_CheckState(page,5);
  if (HVar2 != 0) {
    return HVar2;
  }
  if (0.0 <= line_width) {
    pvVar1 = page->attr;
    HVar2 = HPDF_Stream_WriteReal(*(HPDF_Stream *)((long)pvVar1 + 0x70),line_width);
    if ((HVar2 == 0) &&
       (HVar2 = HPDF_Stream_WriteStr(*(HPDF_Stream *)((long)pvVar1 + 0x70)," w\n"), HVar2 == 0)) {
      *(HPDF_REAL *)(*(long *)((long)pvVar1 + 0x28) + 0x18) = line_width;
      return 0;
    }
    HVar2 = HPDF_CheckError(page->error);
    return HVar2;
  }
  HVar2 = HPDF_RaiseError(page->error,0x1056,0);
  return HVar2;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_SetLineWidth  (HPDF_Page  page,
                         HPDF_REAL  line_width)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_PAGE_DESCRIPTION |
                    HPDF_GMODE_TEXT_OBJECT);
    HPDF_PageAttr attr;

    HPDF_PTRACE ((" HPDF_Page_SetLineWidth\n"));

    if (ret != HPDF_OK)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    if (line_width < 0)
        return HPDF_RaiseError (page->error, HPDF_PAGE_OUT_OF_RANGE, 0);

    if (HPDF_Stream_WriteReal (attr->stream, line_width) != HPDF_OK)
        return HPDF_CheckError (page->error);

    if (HPDF_Stream_WriteStr (attr->stream, " w\012") != HPDF_OK)
        return HPDF_CheckError (page->error);

    attr->gstate->line_width = line_width;

    return ret;
}